

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPUImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int i_4;
  int i_3;
  double *cumulativeScaleFactors;
  int i_2;
  double sum;
  int k_2;
  int i_1;
  int k_1;
  int l;
  int i;
  int k;
  int v;
  int u;
  int scalingFactorsIndex;
  double *freqs;
  double *wt;
  double *rootPartials;
  int endPattern;
  int startPattern;
  int pIndex;
  int p;
  int local_a0;
  int local_9c;
  int local_8c;
  double local_88;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_34;
  
  for (local_34 = 0; local_34 < i_4; local_34 = local_34 + 1) {
    iVar1 = *(int *)(in_R9 + (long)local_34 * 4);
    local_a0 = *(int *)(*(long *)(in_RDI + 0x90) + (long)iVar1 * 4);
    iVar1 = *(int *)(*(long *)(in_RDI + 0x90) + (long)(iVar1 + 1) * 4);
    lVar3 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)*(int *)(in_RSI + (long)local_34 * 4) * 8);
    pdVar4 = *(double **)
              (*(long *)(in_RDI + 0xa0) + (long)*(int *)(in_RDX + (long)local_34 * 4) * 8);
    lVar5 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)*(int *)(in_RCX + (long)local_34 * 4) * 8);
    iVar2 = *(int *)(in_R8 + (long)local_34 * 4);
    local_60 = local_a0 * *(int *)(in_RDI + 0x24);
    local_64 = local_a0 * *(int *)(in_RDI + 0x2c);
    for (local_68 = local_a0; local_68 < iVar1; local_68 = local_68 + 1) {
      for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x24); local_6c = local_6c + 1) {
        *(double *)(*(long *)(in_RDI + 0xe0) + (long)local_60 * 8) =
             *(double *)(lVar3 + (long)local_64 * 8) * *pdVar4;
        local_60 = local_60 + 1;
        local_64 = local_64 + 1;
      }
    }
    for (local_70 = 1; local_70 < *(int *)(in_RDI + 0x34); local_70 = local_70 + 1) {
      local_60 = local_a0 * *(int *)(in_RDI + 0x24);
      local_64 = ((*(int *)(in_RDI + 0x14) - iVar1) + local_a0) * *(int *)(in_RDI + 0x2c) + local_64
      ;
      for (local_74 = local_a0; local_74 < iVar1; local_74 = local_74 + 1) {
        for (local_78 = 0; local_78 < *(int *)(in_RDI + 0x24); local_78 = local_78 + 1) {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)(lVar3 + (long)local_64 * 8);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = pdVar4[local_70];
          auVar13._8_8_ = 0;
          auVar13._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_60 * 8);
          auVar7 = vfmadd213sd_fma(auVar7,auVar10,auVar13);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_60 * 8) = auVar7._0_8_;
          local_60 = local_60 + 1;
          local_64 = local_64 + 1;
        }
      }
    }
    local_60 = local_a0 * *(int *)(in_RDI + 0x24);
    for (local_7c = local_a0; local_7c < iVar1; local_7c = local_7c + 1) {
      local_88 = 0.0;
      for (local_8c = 0; local_8c < *(int *)(in_RDI + 0x24); local_8c = local_8c + 1) {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)(lVar5 + (long)local_8c * 8);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_60 * 8);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_88;
        auVar7 = vfmadd213sd_fma(auVar8,auVar11,auVar14);
        local_88 = auVar7._0_8_;
        local_60 = local_60 + 1;
      }
      dVar6 = log(local_88);
      *(double *)(*(long *)(in_RDI + 0x110) + (long)local_7c * 8) = dVar6;
    }
    if (-1 < iVar2) {
      lVar3 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)iVar2 * 8);
      for (local_9c = local_a0; local_9c < iVar1; local_9c = local_9c + 1) {
        *(double *)(*(long *)(in_RDI + 0x110) + (long)local_9c * 8) =
             *(double *)(lVar3 + (long)local_9c * 8) +
             *(double *)(*(long *)(in_RDI + 0x110) + (long)local_9c * 8);
      }
    }
    cumulativeScaleFactors[local_34] = 0.0;
    for (; local_a0 < iVar1; local_a0 = local_a0 + 1) {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x110) + (long)local_a0 * 8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_a0 * 8);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = cumulativeScaleFactors[local_34];
      auVar7 = vfmadd213sd_fma(auVar9,auVar12,auVar15);
      cumulativeScaleFactors[local_34] = auVar7._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                         const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* cumulativeScaleIndices,
                                                         const int* partitionIndices,
                                                         int partitionCount,
                                                         double* outSumLogLikelihoodByPartition) {

    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[p]];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];
        int u = startPattern * kStateCount;
        int v = startPattern * kPartialsPaddedStateCount;
        for (int k = startPattern; k < endPattern; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = startPattern * kStateCount;
            v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            for (int k = startPattern; k < endPattern; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = startPattern * kStateCount;
        for (int k = startPattern; k < endPattern; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += freqs[i] * integrationTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sum);
        }

        if (scalingFactorsIndex >= 0) {
            const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
            for(int i=startPattern; i<endPattern; i++) {
                outLogLikelihoodsTmp[i] += cumulativeScaleFactors[i];
            }
        }

        outSumLogLikelihoodByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[i] * gPatternWeights[i];
        }

    }

}